

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_configsocket.c
# Opt level: O0

int os_fd_generic_configsocket
              (os_fd *sock,netaddr_socket *bind_to,size_t recvbuf,_Bool rawip,os_interface *os_if,
              oonf_log_source log_src)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 uVar6;
  undefined4 local_180;
  undefined4 local_17c;
  int value;
  socklen_t addrlen;
  netaddr_str buf;
  netaddr_socket bindto;
  oonf_log_source log_src_local;
  os_interface *os_if_local;
  size_t sStack_a0;
  _Bool rawip_local;
  size_t recvbuf_local;
  netaddr_socket *bind_to_local;
  os_fd *sock_local;
  netaddr_socket *local_80;
  undefined4 local_78;
  oonf_log_source local_74;
  uint8_t *local_70;
  undefined4 local_68;
  oonf_log_source local_64;
  uint8_t *local_60;
  undefined4 local_58;
  oonf_log_source local_54;
  uint8_t *local_50;
  undefined4 local_48;
  oonf_log_source local_44;
  uint8_t *local_40;
  undefined4 local_38;
  oonf_log_source local_34;
  uint8_t *local_30;
  undefined4 local_28;
  oonf_log_source local_24;
  uint8_t *local_20;
  char *local_18;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  sStack_a0 = recvbuf;
  recvbuf_local = (size_t)bind_to;
  bind_to_local = (netaddr_socket *)sock;
  memcpy(buf.buf + 0x36,bind_to,0x80);
  local_80 = bind_to_local;
  iVar1 = os_fd_generic_set_nonblocking((os_fd *)&bind_to_local->v4);
  if (iVar1 == 0) {
    if ((!rawip) && (*(short *)recvbuf_local == 10)) {
      local_180 = 1;
      iVar1 = setsockopt(*(int *)bind_to_local,0x29,0x1a,&local_180,4);
      if (iVar1 < 0) {
        local_30 = log_global_mask;
        local_38 = 4;
        local_34 = log_src;
        if ((log_global_mask[log_src] & 4) != 0) {
          piVar3 = __errno_location();
          pcVar2 = strerror(*piVar3);
          piVar3 = __errno_location();
          oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",0x5a
                   ,(void *)0x0,0,"Could not force socket to IPv6 only, continue: %s (%d)\n",pcVar2,
                   CONCAT44(uVar6,*piVar3));
        }
      }
    }
    if ((os_if != (os_interface *)0x0) && (((os_if->flags).any & 1U) == 0)) {
      iVar1 = *(int *)bind_to_local;
      sVar5 = strlen(os_if->name);
      iVar1 = setsockopt(iVar1,1,0x19,os_if->name,(int)sVar5 + 1);
      if (iVar1 < 0) {
        local_40 = log_global_mask;
        local_48 = 4;
        if ((log_global_mask[log_src] & 4) != 0) {
          local_44 = log_src;
          piVar3 = __errno_location();
          pcVar2 = strerror(*piVar3);
          piVar3 = __errno_location();
          oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",99,
                   (void *)0x0,0,"Cannot bind socket to interface %s: %s (%d)\n",os_if->name,pcVar2,
                   *piVar3);
        }
        return -1;
      }
    }
    local_180 = 1;
    iVar1 = setsockopt(*(int *)bind_to_local,1,2,&local_180,4);
    if (iVar1 < 0) {
      local_50 = log_global_mask;
      local_58 = 4;
      if ((log_global_mask[log_src] & 4) != 0) {
        local_54 = log_src;
        pcVar2 = netaddr_socket_to_string
                           ((netaddr_str *)((long)&value + 2),(netaddr_socket *)(buf.buf + 0x36));
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        piVar3 = __errno_location();
        oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",0x6d,
                 (void *)0x0,0,"Cannot reuse address for %s: %s (%d)\n",pcVar2,pcVar4,*piVar3);
      }
      sock_local._4_4_ = -1;
    }
    else {
      if (sStack_a0 != 0) {
        while ((0x2000 < sStack_a0 &&
               (iVar1 = setsockopt(*(int *)bind_to_local,1,8,&stack0xffffffffffffff60,8), iVar1 != 0
               ))) {
          sStack_a0 = sStack_a0 - 0x400;
        }
        if (sStack_a0 < 0x2000) {
          local_60 = log_global_mask;
          local_68 = 4;
          if ((log_global_mask[log_src] & 4) != 0) {
            local_64 = log_src;
            pcVar2 = netaddr_socket_to_string
                               ((netaddr_str *)((long)&value + 2),(netaddr_socket *)(buf.buf + 0x36)
                               );
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            piVar3 = __errno_location();
            oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",
                     0x86,(void *)0x0,0,"Cannot setup receive buffer size for %s: %s (%d)\n",pcVar2,
                     pcVar4,*piVar3);
          }
          return -1;
        }
      }
      if (os_if != (os_interface *)0x0) {
        local_18 = buf.buf + 0x36;
      }
      local_17c = 0x80;
      iVar1 = bind(*(int *)bind_to_local,(sockaddr *)(buf.buf + 0x36),0x80);
      if (iVar1 < 0) {
        local_70 = log_global_mask;
        local_78 = 4;
        if ((log_global_mask[log_src] & 4) != 0) {
          local_74 = log_src;
          pcVar2 = netaddr_socket_to_string
                             ((netaddr_str *)((long)&value + 2),(netaddr_socket *)(buf.buf + 0x36));
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          piVar3 = __errno_location();
          oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",0x95
                   ,(void *)0x0,0,"Cannot bind socket to address %s: %s (%d)\n",pcVar2,pcVar4,
                   *piVar3);
        }
        sock_local._4_4_ = -1;
      }
      else {
        sock_local._4_4_ = 0;
      }
    }
  }
  else {
    local_20 = log_global_mask;
    local_28 = 4;
    if ((log_global_mask[log_src] & 4) != 0) {
      local_24 = log_src;
      pcVar2 = netaddr_socket_to_string
                         ((netaddr_str *)((long)&value + 2),(netaddr_socket *)(buf.buf + 0x36));
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      piVar3 = __errno_location();
      oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",0x52,
               (void *)0x0,0,"Cannot make socket non-blocking %s: %s (%d)\n",pcVar2,pcVar4,*piVar3);
    }
    sock_local._4_4_ = -1;
  }
  return sock_local._4_4_;
}

Assistant:

int
os_fd_generic_configsocket(struct os_fd *sock, const union netaddr_socket *bind_to, size_t recvbuf, bool rawip,
  const struct os_interface *os_if, enum oonf_log_source log_src) {
  union netaddr_socket bindto;
  struct netaddr_str buf;
  socklen_t addrlen;
  int value;

  /* temporary copy bindto address */
  memcpy(&bindto, bind_to, sizeof(bindto));

  if (os_fd_set_nonblocking(sock)) {
    OONF_WARN(log_src, "Cannot make socket non-blocking %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }

#if defined(IPV6_V6ONLY)
  if (!rawip && bind_to->std.sa_family == AF_INET6) {
    value = 1;
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&value, sizeof(value)) < 0) {
      OONF_WARN(log_src, "Could not force socket to IPv6 only, continue: %s (%d)\n", strerror(errno), errno);
    }
  }
#endif

#if defined(SO_BINDTODEVICE)
  /* this is binding the socket, not a multicast address */
  if (os_if != NULL && !os_if->flags.any &&
      setsockopt(sock->fd, SOL_SOCKET, SO_BINDTODEVICE, os_if->name, strlen(os_if->name) + 1) < 0) {
    OONF_WARN(log_src, "Cannot bind socket to interface %s: %s (%d)\n", os_if->name, strerror(errno), errno);
    return -1;
  }
#endif

#if defined(SO_REUSEADDR)
  /* allow to reuse address */
  value = 1;
  if (setsockopt(sock->fd, SOL_SOCKET, SO_REUSEADDR, &value, sizeof(value)) < 0) {
    OONF_WARN(log_src, "Cannot reuse address for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }
#endif

#if defined(IP_RECVIF)
  if (os_if != NULL && setsockopt(sock, IPPROTO_IP, IP_RECVIF, &yes, sizeof(yes)) < 0) {
    OONF_WARN(log_src, "Cannot apply IP_RECVIF for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }
#endif

#if defined(SO_RCVBUF)
  if (recvbuf > 0) {
    while (recvbuf > 8192) {
      if (setsockopt(sock->fd, SOL_SOCKET, SO_RCVBUF, (void *)&recvbuf, sizeof(recvbuf)) == 0) {
        break;
      }

      recvbuf -= 1024;
    }

    if (recvbuf < 8192) {
      OONF_WARN(log_src, "Cannot setup receive buffer size for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
        strerror(errno), errno);
      return -1;
    }
  }
#endif

  /* add ipv6 interface scope if necessary */
  if (os_if != NULL && netaddr_socket_get_addressfamily(&bindto) == AF_INET6) {
    bindto.v6.sin6_scope_id = os_if->index;
  }

  /* bind the socket to the port number */
  addrlen = sizeof(bindto);
  if (bind(sock->fd, &bindto.std, addrlen) < 0) {
    OONF_WARN(log_src, "Cannot bind socket to address %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);

    return -1;
  }

  return 0;
}